

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O3

void __thiscall github111116::ConsoleLogger::print<char[19]>(ConsoleLogger *this,char (*t) [19])

{
  ostream *poVar1;
  char cVar2;
  size_t sVar3;
  
  poVar1 = this->out;
  sVar3 = strlen(*t);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,*t,sVar3);
  cVar2 = (char)this->out;
  std::ios::widen((char)*(undefined8 *)(*(long *)this->out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  return;
}

Assistant:

void ConsoleLogger::print(const T& t)
{
	out << t;
	print();
}